

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

int lzham::lzham_lib_z_inflate(lzham_z_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  lzham_z_internal_state *p;
  lzham_decompress_status_t lVar3;
  lzham_uint8 *pOut_buf;
  uint uVar4;
  uint uVar5;
  lzham_uint8 *pIn_buf;
  uint uVar6;
  uint uVar7;
  size_t out_bytes;
  size_t in_bytes;
  
  uVar5 = 0xfffffffe;
  if ((pStream != (lzham_z_streamp)0x0) && (p = pStream->state, p != (lzham_z_internal_state *)0x0))
  {
    uVar7 = 2;
    if ((flush & 0xfffffffdU) != 1) {
      uVar7 = flush;
    }
    if ((uVar7 < 5) && ((0x15U >> (uVar7 & 0x1f) & 1) != 0)) {
      if (*(int *)(p + 0x704) < 3) {
        if (uVar7 == 4 || *(uint *)(p + 0x70c) == 0) {
          uVar5 = pStream->avail_in;
          *(uint *)(p + 0x70c) = *(uint *)(p + 0x70c) | (uint)(uVar7 == 4);
          uVar4 = pStream->avail_in;
          uVar6 = pStream->avail_out;
          pIn_buf = pStream->next_in;
          pOut_buf = pStream->next_out;
          do {
            while( true ) {
              in_bytes = (size_t)uVar4;
              out_bytes = (size_t)uVar6;
              lVar3 = lzham_lib_decompress
                                (p,pIn_buf,&in_bytes,pOut_buf,&out_bytes,(uint)(uVar7 == 4));
              *(lzham_decompress_status_t *)(p + 0x704) = lVar3;
              pIn_buf = pStream->next_in + (in_bytes & 0xffffffff);
              pStream->next_in = pIn_buf;
              uVar1 = pStream->avail_in;
              uVar2 = pStream->avail_out;
              uVar4 = uVar1 - (uint)in_bytes;
              pStream->avail_in = uVar4;
              pStream->total_in = pStream->total_in + (in_bytes & 0xffffffff);
              pStream->adler = (ulong)*(uint *)(p + 0xf8);
              pOut_buf = pStream->next_out + (out_bytes & 0xffffffff);
              pStream->next_out = pOut_buf;
              uVar6 = uVar2 - (uint)out_bytes;
              pStream->avail_out = uVar6;
              pStream->total_out = pStream->total_out + (out_bytes & 0xffffffff);
              if (3 < (int)lVar3) {
                return (uint)(lVar3 == LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES) * 5 + -3;
              }
              if ((lVar3 == LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT) && (uVar5 == 0)) {
                return -5;
              }
              if (uVar7 != 4) break;
              if (lVar3 == LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT) {
                return -5;
              }
              if (lVar3 == LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
                return 1;
              }
            }
          } while (((lVar3 != LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) &&
                   (uVar1 != (uint)in_bytes)) && (uVar2 != (uint)out_bytes));
          uVar5 = (uint)(lVar3 == LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE);
        }
      }
      else {
        uVar5 = 0xfffffffd;
      }
    }
  }
  return uVar5;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflate(lzham_z_streamp pStream, int flush)
   {
      if ((!pStream) || (!pStream->state)) 
         return LZHAM_Z_STREAM_ERROR;
            
      if ((flush == LZHAM_Z_PARTIAL_FLUSH) || (flush == LZHAM_Z_FULL_FLUSH))
         flush = LZHAM_Z_SYNC_FLUSH;
      if (flush)
      {
         if ((flush != LZHAM_Z_SYNC_FLUSH) && (flush != LZHAM_Z_FINISH)) 
            return LZHAM_Z_STREAM_ERROR;
      }

      size_t orig_avail_in = pStream->avail_in;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      lzham_decompressor *pDecomp = static_cast<lzham_decompressor *>(pState);
      if (pDecomp->m_z_last_status >= LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
         return LZHAM_Z_DATA_ERROR;

      if (pDecomp->m_z_has_flushed && (flush != LZHAM_Z_FINISH)) 
         return LZHAM_Z_STREAM_ERROR;
      pDecomp->m_z_has_flushed |= (flush == LZHAM_Z_FINISH);

      lzham_decompress_status_t status;
      for ( ; ; )
      {
         size_t in_bytes = pStream->avail_in;
         size_t out_bytes = pStream->avail_out;
         lzham_bool no_more_input_bytes_flag = (flush == LZHAM_Z_FINISH);
         status = lzham_lib_decompress(pState, pStream->next_in, &in_bytes, pStream->next_out, &out_bytes, no_more_input_bytes_flag);
         
         pDecomp->m_z_last_status = status;

         pStream->next_in += (uint)in_bytes; 
         pStream->avail_in -= (uint)in_bytes;
         pStream->total_in += (uint)in_bytes; 
         pStream->adler = pDecomp->m_decomp_adler32;

         pStream->next_out += (uint)out_bytes;
         pStream->avail_out -= (uint)out_bytes;
         pStream->total_out += (uint)out_bytes;
                  
         if (status >= LZHAM_DECOMP_STATUS_FIRST_FAILURE_CODE)
         {
            if (status == LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES)
               return LZHAM_Z_NEED_DICT;
            else 
               return LZHAM_Z_DATA_ERROR; // Stream is corrupted (there could be some uncompressed data left in the output dictionary - oh well).
         }
         
         if ((status == LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT) && (!orig_avail_in))
            return LZHAM_Z_BUF_ERROR; // Signal caller that we can't make forward progress without supplying more input, or by setting flush to LZHAM_Z_FINISH.
         else if (flush == LZHAM_Z_FINISH)
         {
            // Caller has indicated that all remaining input was at next_in, and all remaining output will fit entirely in next_out.
            // (The output buffer at next_out MUST be large to hold the remaining uncompressed data when flush==LZHAM_Z_FINISH).
            if (status == LZHAM_DECOMP_STATUS_SUCCESS)
               return LZHAM_Z_STREAM_END;
            // If status is LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT, there must be at least 1 more byte on the way but the caller to lzham_decompress() supplied an empty output buffer.
            // Something is wrong because the caller's output buffer should be large enough to hold the entire decompressed stream when flush==LZHAM_Z_FINISH.
            else if (status == LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT)
               return LZHAM_Z_BUF_ERROR;
         }
         else if ((status == LZHAM_DECOMP_STATUS_SUCCESS) || (!pStream->avail_in) || (!pStream->avail_out))
            break;
      }

      return (status == LZHAM_DECOMP_STATUS_SUCCESS) ? LZHAM_Z_STREAM_END : LZHAM_Z_OK;
   }